

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,TypeEnum type)

{
  Enum EVar1;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  CWriter *local_18;
  CWriter *this_local;
  TypeEnum type_local;
  
  local_18 = this;
  this_local = (CWriter *)type.type;
  EVar1 = Type::operator_cast_to_Enum((Type *)&this_local);
  switch(EVar1) {
  case ExternRef:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,"WASM_RT_EXTERNREF");
    Write(this,local_88);
    break;
  case FuncRef:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,"WASM_RT_FUNCREF");
    Write(this,local_78);
    break;
  default:
    abort();
  case V128:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,"WASM_RT_V128");
    Write(this,local_68);
    break;
  case F64:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,"WASM_RT_F64");
    Write(this,local_58);
    break;
  case F32:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"WASM_RT_F32");
    Write(this,local_48);
    break;
  case I64:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"WASM_RT_I64");
    Write(this,local_38);
    break;
  case I32:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"WASM_RT_I32");
    Write(this,local_28);
  }
  return;
}

Assistant:

void CWriter::Write(TypeEnum type) {
  // clang-format off
  switch (type.type) {
    case Type::I32: Write("WASM_RT_I32"); break;
    case Type::I64: Write("WASM_RT_I64"); break;
    case Type::F32: Write("WASM_RT_F32"); break;
    case Type::F64: Write("WASM_RT_F64"); break;
    case Type::V128: Write("WASM_RT_V128"); break;
    case Type::FuncRef: Write("WASM_RT_FUNCREF"); break;
    case Type::ExternRef: Write("WASM_RT_EXTERNREF"); break;
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}